

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::
MergeCapturedValues<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,GlobOptBlockData::MergeBlockData(BasicBlock*,BasicBlock*,BVSparse<Memory::JitArenaAllocator>*,BVSparse<Memory::JitArenaAllocator>*,bool)::__0>
          (GlobOptBlockData *this,
          SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *toList,SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *fromList)

{
  code *pcVar1;
  Sym *this_00;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  NodeBase *pNVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type_conflict pSVar7;
  StackSym *pSVar8;
  Type *symValueTo;
  Type *pTVar9;
  StackSym *pSVar10;
  NodeBase **local_180;
  bool local_109;
  Sym *symRemain;
  Iterator iterRemain;
  bool hasRemain;
  Sym *symTo;
  Sym *symFrom;
  undefined1 auStack_b8 [6];
  bool hasFrom;
  bool hasTo;
  Iterator iterFrom;
  Iterator iterTo;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *fromList_local;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *toList_local;
  GlobOptBlockData *this_local;
  Sym **local_78;
  bool local_69;
  NodeBase **local_68;
  bool local_59;
  undefined1 *local_58;
  bool local_49;
  NodeBase **local_48;
  bool local_39;
  undefined1 *local_38;
  bool local_29;
  undefined1 *local_28;
  bool local_19;
  NodeBase **local_18;
  bool local_9;
  
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::Iterator::Iterator((Iterator *)&iterFrom.current,toList);
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::Iterator::Iterator((Iterator *)auStack_b8,fromList);
  local_18 = &iterFrom.current;
  if (iterTo.list ==
      (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pNVar3 = iterFrom.current;
  pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  local_9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      *)pNVar3,pSVar7);
  if (local_9) {
    iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0;
  }
  else {
    iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   *)SListNodeBase<Memory::ArenaAllocator>::Next
                               (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  }
  local_9 = !local_9;
  bVar4 = local_9;
  if (fromList ==
      (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
       *)0x0) {
    local_109 = false;
  }
  else {
    local_28 = auStack_b8;
    if (iterFrom.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar2 = _auStack_b8;
    pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::IsHead(pSVar2,pSVar7);
    if (local_19) {
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_19 = !local_19;
    local_109 = local_19;
  }
  while( true ) {
    bVar5 = false;
    if (local_109) {
      bVar5 = bVar4;
    }
    if (!bVar5) break;
    pTVar9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)auStack_b8);
    pSVar10 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar9);
    pTVar9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&iterFrom.current);
    pSVar8 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar9);
    if ((pSVar10->super_Sym).m_id < (pSVar8->super_Sym).m_id) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar10->super_Sym).m_id);
      local_38 = auStack_b8;
      if (iterFrom.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pSVar2 = _auStack_b8;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar5 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead(pSVar2,pSVar7);
      if (bVar5) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
      }
      else {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_29 = !bVar5;
      local_109 = local_29;
    }
    else if ((pSVar8->super_Sym).m_id < (pSVar10->super_Sym).m_id) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar8->super_Sym).m_id);
      local_48 = &iterFrom.current;
      if (iterTo.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pNVar3 = iterFrom.current;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)pNVar3,pSVar7);
      if (bVar4) {
        iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0;
      }
      else {
        iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)SListNodeBase<Memory::ArenaAllocator>::Next
                                   (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_39 = !bVar4;
      bVar4 = local_39;
    }
    else {
      pTVar9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)auStack_b8);
      symValueTo = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)&iterFrom.current);
      bVar4 = MergeBlockData::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&this_local + 7),pTVar9,symValueTo);
      if (!bVar4) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar8->super_Sym).m_id);
      }
      local_58 = auStack_b8;
      if (iterFrom.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pSVar2 = _auStack_b8;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead(pSVar2,pSVar7);
      if (bVar4) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
      }
      else {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_49 = !bVar4;
      local_109 = local_49;
      local_68 = &iterFrom.current;
      if (iterTo.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pNVar3 = iterFrom.current;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)pNVar3,pSVar7);
      if (bVar4) {
        iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0;
      }
      else {
        iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)SListNodeBase<Memory::ArenaAllocator>::Next
                                   (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_59 = !bVar4;
      bVar4 = local_59;
    }
  }
  iterRemain.current._7_1_ = true;
  if (!local_109) {
    iterRemain.current._7_1_ = bVar4;
  }
  if ((bool)iterRemain.current._7_1_ != false) {
    if (local_109) {
      local_180 = (NodeBase **)auStack_b8;
    }
    else {
      local_180 = &iterFrom.current;
    }
    symRemain = (Sym *)*local_180;
    iterRemain.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)local_180[1];
    do {
      pTVar9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)&symRemain);
      pSVar10 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar9);
      BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar10->super_Sym).m_id);
      local_78 = &symRemain;
      if (iterRemain.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = symRemain;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterRemain.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)this_00,pSVar7);
      if (bVar4) {
        iterRemain.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
      }
      else {
        iterRemain.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iterRemain.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_69 = !bVar4;
      iterRemain.current._7_1_ = local_69;
    } while (local_69);
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeCapturedValues(
    SListBase<CapturedList> * toList,
    SListBase<CapturedList> * fromList,
    CapturedItemsAreEqual itemsAreEqual)
{
    typename SListBase<CapturedList>::Iterator iterTo(toList);
    typename SListBase<CapturedList>::Iterator iterFrom(fromList);
    bool hasTo = iterTo.Next();
    bool hasFrom = fromList == nullptr ? false : iterFrom.Next();

    // to be conservative, only copy the captured value for common sym Ids
    // in from and to CapturedList, mark all non-common sym Ids for re-capture
    while (hasFrom && hasTo)
    {
        Sym * symFrom = iterFrom.Data().Key();
        Sym * symTo = iterTo.Data().Key();

        if (symFrom->m_id < symTo->m_id)
        {
            this->changedSyms->Set(symFrom->m_id);
            hasFrom = iterFrom.Next();
        }
        else if(symFrom->m_id > symTo->m_id)
        {
            this->changedSyms->Set(symTo->m_id);
            hasTo = iterTo.Next();
        }
        else
        {
            if (!itemsAreEqual(&iterFrom.Data(), &iterTo.Data()))
            {
                this->changedSyms->Set(symTo->m_id);
            }

            hasFrom = iterFrom.Next();
            hasTo = iterTo.Next();
        }
    }
    bool hasRemain = hasFrom || hasTo;
    if (hasRemain)
    {
        typename SListBase<CapturedList>::Iterator iterRemain(hasFrom ? iterFrom : iterTo);
        do
        {
            Sym * symRemain = iterRemain.Data().Key();
            this->changedSyms->Set(symRemain->m_id);
            hasRemain = iterRemain.Next();
        } while (hasRemain);
    }
}